

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_25fcf1::LogisimParser::parse_xml(LogisimParser *this)

{
  CircuitConstruction *pCVar1;
  size_type *psVar2;
  long lVar3;
  undefined1 *puVar4;
  xml_node_struct *pxVar5;
  size_type *psVar6;
  pointer pvVar7;
  pointer puVar8;
  __node_base_ptr p_Var9;
  ComponentProperties *pCVar10;
  _Base_ptr __s1;
  _Base_ptr __n;
  _Hash_node_base **pp_Var11;
  anon_struct_8_2_43e46ec4_for_Position_0 aVar12;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
  *p_Var13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
  *p_Var14;
  LSimContext *pLVar15;
  Value pull_to;
  size_t sVar16;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
  *this_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
  *this_01;
  _Alloc_hider _Var17;
  _Alloc_hider _Var18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  xml_node *pxVar22;
  ModelCircuit *pMVar23;
  char_t *pcVar24;
  ModelComponent *component;
  mapped_type *pmVar25;
  pin_id_t pVar26;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_02;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_03;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  __position;
  ModelWire *this_04;
  _Hash_node_base *p_Var27;
  _Hash_node_base *p_Var28;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var29;
  _Rb_tree_node_base *p_Var30;
  long lVar31;
  ulong uVar32;
  __node_ptr p_Var33;
  Position *pPVar34;
  __node_base_ptr *__s_00;
  __node_base_ptr *pp_Var35;
  __hash_code __code;
  ComponentProperties *props;
  uint7 uVar41;
  _Hash_node_base *p_Var36;
  undefined8 uVar37;
  _Hash_node_base _Var38;
  xml_node_struct *pxVar39;
  _Hash_node_base **pp_Var40;
  Position *pos;
  Position *pos_00;
  Position *pos_01;
  string *__args;
  ulong uVar42;
  size_type sVar43;
  key_type *__key;
  ulong uVar44;
  wire_node_t *__range2;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar45;
  char *pcVar46;
  iterator iVar47;
  __node_ptr __n_00;
  __node_ptr __n_01;
  unsigned_long *point;
  pointer puVar48;
  Value value;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *node;
  pointer pvVar49;
  unsigned_long *w;
  undefined1 auVar50 [16];
  initializer_list<unsigned_long> __l;
  xml_node main_node;
  xml_attribute attr_val;
  xml_attribute attr_name;
  wire_container_t *__range1;
  string prop_val;
  string comp_type;
  xml_node circuit_node;
  xml_node comp;
  xml_attribute attr_loc;
  string wire_from;
  string prop_name;
  xml_node project_node;
  xml_node name_node;
  xml_attribute attr_name_1;
  xml_node prop;
  string comp_loc;
  xml_named_node_iterator __end1_1;
  xml_named_node_iterator __begin1_1;
  xml_named_node_iterator __begin1_2;
  string wire_to;
  xml_named_node_iterator __end1_2;
  xml_named_node_iterator __begin1;
  xml_named_node_iterator __end1;
  Position local_348;
  ulong uStack_340;
  Position local_338;
  uint uStack_330;
  undefined4 uStack_32c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_328;
  char_t *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  uint32_t local_308;
  undefined2 local_304;
  undefined8 local_300;
  undefined4 local_2f8;
  undefined2 local_2f4;
  xml_attribute local_2e8;
  allocator local_2d9;
  __node_base_ptr *local_2d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2d0;
  __node_base *local_2c8;
  xml_attribute local_2c0;
  __node_base *local_2b8;
  wire_container_t *local_2b0;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a8;
  xml_node_struct *local_2a0;
  xml_node_struct *local_298;
  undefined1 local_290 [16];
  string local_280;
  xml_node_struct *local_260;
  xml_node local_258;
  xml_node local_250;
  undefined1 local_248 [16];
  Position local_238 [2];
  _Alloc_hider local_228;
  xml_node_struct *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  undefined1 local_208 [40];
  __node_base_ptr *local_1e0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1d0;
  _Prime_rehash_policy *local_1c8;
  Position *local_1c0;
  xml_node local_1b8;
  xml_node local_1b0;
  xml_attribute local_1a8;
  xml_node local_1a0;
  Position local_198;
  ulong uStack_190;
  Position local_188 [2];
  string local_178;
  string local_158;
  Position local_138 [2];
  pointer local_128;
  undefined1 local_118 [24];
  xml_node local_100;
  __node_base _Stack_f8;
  Position local_f0;
  xml_named_node_iterator local_e8;
  undefined8 local_c8;
  __node_base *local_c0;
  __node_base local_b8;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  char_t *local_a8;
  _Rb_tree_node_base *local_a0;
  xml_named_node_iterator local_98;
  xml_named_node_iterator local_78;
  xml_object_range<pugi::xml_named_node_iterator> local_60;
  
  local_1b8 = pugi::xml_node::child(&this->m_xml_doc->super_xml_node,"project");
  bVar19 = pugi::xml_node::operator!(&local_1b8);
  if (bVar19) {
    bVar19 = false;
  }
  else {
    pugi::xml_node::children(&local_60,&local_1b8,"circuit");
    local_98._name = local_60._begin._name;
    local_98._wrap._root = local_60._begin._wrap._root;
    local_98._parent._root = local_60._begin._parent._root;
    local_78._name = local_60._end._name;
    local_78._wrap._root = local_60._end._wrap._root;
    local_78._parent._root = local_60._end._parent._root;
    bVar19 = pugi::xml_named_node_iterator::operator!=(&local_98,&local_78);
    if (bVar19) {
      pCVar1 = &this->m_context;
      pmVar45 = (this->m_context).m_circuit_ipins;
      local_b0 = (this->m_context).m_circuit_ipins + 1;
      local_1d8 = &(this->m_context).m_pin_locs._M_h;
      local_2d0 = &(this->m_context).m_ipin_offsets._M_h;
      local_2b0 = &(this->m_context).m_wires;
      local_1d0 = &(this->m_context).m_tunnels._M_h;
      local_1c8 = &(this->m_context).m_ipin_offsets._M_h._M_rehash_policy;
      local_2d8 = &(this->m_context).m_ipin_offsets._M_h._M_single_bucket;
      local_2c8 = &(this->m_context).m_ipin_offsets._M_h._M_before_begin;
      local_c8 = &(this->m_circuits)._M_h._M_rehash_policy;
      local_1e0 = &(this->m_circuits)._M_h._M_single_bucket;
      local_2b8 = &(this->m_circuits)._M_h._M_before_begin;
      local_b8._M_nxt = (_Hash_node_base *)&(this->m_context).m_pin_locs._M_h._M_rehash_policy;
      local_260 = (xml_node_struct *)&(this->m_context).m_pin_locs._M_h._M_single_bucket;
      local_c0 = &(this->m_context).m_pin_locs._M_h._M_before_begin;
      local_2a8 = pmVar45;
      do {
        pxVar22 = pugi::xml_named_node_iterator::operator*(&local_98);
        local_258._root = pxVar22->_root;
        local_1b0 = pugi::xml_node::find_child_by_attribute(&local_258,"a","name","circuit");
        bVar19 = pugi::xml_node::operator!(&local_1b0);
        if (!bVar19) {
          local_348.field_0 =
               (anon_struct_8_2_43e46ec4_for_Position_0)pugi::xml_node::attribute(&local_1b0,"val");
          local_a8 = pugi::xml_attribute::value((xml_attribute *)&local_348.field_0);
          pMVar23 = lsim::ModelCircuitLibrary::create_circuit
                              (&this->m_lsim_context->m_user_library,local_a8,this->m_lsim_context);
          (this->m_context).m_circuit = pMVar23;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&pmVar45->_M_t);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&local_b0->_M_t);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(local_1d8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear(local_2d0);
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_erase_at_end(local_2b0,
                            (this->m_context).m_wires.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear(local_1d0);
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)local_118,&local_258,"comp")
          ;
          local_158.field_2._M_allocated_capacity = local_118._16_8_;
          local_158._M_dataplus._M_p = (pointer)local_118._0_8_;
          local_158._M_string_length = local_118._8_8_;
          props = (ComponentProperties *)&local_100;
          local_178.field_2._M_allocated_capacity = (size_type)local_f0;
          local_178._M_dataplus._M_p = (pointer)local_100._root;
          local_178._M_string_length = (size_type)_Stack_f8._M_nxt;
          while( true ) {
            bVar19 = pugi::xml_named_node_iterator::operator!=
                               ((xml_named_node_iterator *)&local_158,
                                (xml_named_node_iterator *)&local_178);
            if (!bVar19) break;
            pxVar22 = pugi::xml_named_node_iterator::operator*
                                ((xml_named_node_iterator *)&local_158);
            local_250._root = pxVar22->_root;
            local_2c0 = pugi::xml_node::attribute(&local_250,"name");
            bVar19 = pugi::xml_attribute::operator!(&local_2c0);
            if (!bVar19) {
              pcVar24 = pugi::xml_attribute::value(&local_2c0);
              std::__cxx11::string::string
                        ((string *)(local_290 + 0x10),pcVar24,(allocator *)&local_348.field_0);
              local_248._0_8_ = pugi::xml_node::attribute(&local_250,"loc");
              bVar19 = pugi::xml_attribute::operator!((xml_attribute *)local_248);
              if (!bVar19) {
                pcVar24 = pugi::xml_attribute::value((xml_attribute *)local_248);
                std::__cxx11::string::string
                          ((string *)&local_198.field_0,pcVar24,(allocator *)&local_348.field_0);
                props = (ComponentProperties *)0x0;
                local_348.m_full = 0;
                local_338.m_full = 0;
                paStack_328 = &local_318;
                local_320 = (char_t *)0x0;
                local_318._M_local_buf[0] = '\0';
                local_304 = 0;
                uStack_330 = 1;
                uStack_340 = CONCAT44(uStack_340._4_4_,2);
                local_308 = 1;
                local_300 = 0x200000002;
                local_2f8 = 0xffffffff;
                local_2f4 = 0;
                bVar19 = parse_location((LogisimParser *)&local_198.field_0,
                                        (string *)&local_338.field_0,pos);
                if (!bVar19) goto LAB_0016fccd;
                pugi::xml_node::children
                          ((xml_object_range<pugi::xml_named_node_iterator> *)(local_248 + 0x10),
                           &local_250,"a");
                local_128 = local_228._M_p;
                local_138[0] = local_238[0];
                local_138[1] = local_238[1];
                props = (ComponentProperties *)(local_248 + 0x28);
                local_e8._name = (char_t *)aStack_218._8_8_;
                local_e8._wrap._root = local_220;
                local_e8._parent._root = (xml_node_struct *)aStack_218._M_allocated_capacity;
                bVar19 = false;
                value = VALUE_TRUE;
                pull_to = VALUE_FALSE;
                while (bVar20 = pugi::xml_named_node_iterator::operator!=
                                          ((xml_named_node_iterator *)&local_138[0].field_0,
                                           &local_e8), bVar20) {
                  pxVar22 = pugi::xml_named_node_iterator::operator*
                                      ((xml_named_node_iterator *)&local_138[0].field_0);
                  local_1a0._root = pxVar22->_root;
                  local_1a8 = pugi::xml_node::attribute(&local_1a0,"name");
                  bVar20 = pugi::xml_attribute::operator!(&local_1a8);
                  if (bVar20) goto LAB_0016fccd;
                  pcVar24 = pugi::xml_attribute::value(&local_1a8);
                  std::__cxx11::string::string((string *)local_208,pcVar24,(allocator *)&local_2a0);
                  local_2e8 = pugi::xml_node::attribute(&local_1a0,"val");
                  bVar20 = pugi::xml_attribute::operator!(&local_2e8);
                  if (!bVar20) {
                    pcVar24 = pugi::xml_attribute::value(&local_2e8);
                    std::__cxx11::string::string((string *)&local_2a0,pcVar24,&local_2d9);
                    iVar21 = std::__cxx11::string::compare(local_208);
                    if (iVar21 == 0) {
                      std::__cxx11::string::_M_assign((string *)&paStack_328);
                    }
                    else {
                      iVar21 = std::__cxx11::string::compare(local_208);
                      if (iVar21 == 0) {
                        iVar21 = pugi::xml_attribute::as_int(&local_2e8,local_348.field_0.m_y);
                        local_348.field_0.m_y = iVar21;
                      }
                      else {
                        iVar21 = std::__cxx11::string::compare(local_208);
                        if (iVar21 == 0) {
                          iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                          if (iVar21 == 0) {
                            uStack_330 = 0;
                          }
                          else {
                            iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                            if (iVar21 == 0) {
                              uStack_330 = 1;
                            }
                            else {
                              iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                              if (iVar21 == 0) {
                                uStack_330 = 2;
                              }
                              else {
                                iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                                pcVar46 = "Invalid facing \"%s\"";
                                if (iVar21 == 0) {
                                  uStack_330 = 3;
                                }
                                else {
LAB_0016f597:
                                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                            ,pcVar46,local_2a0);
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar21 = std::__cxx11::string::compare(local_208);
                          if (iVar21 == 0) {
                            iVar21 = pugi::xml_attribute::as_int(&local_2e8,(uint32_t)uStack_340);
                            uStack_340 = CONCAT44(uStack_340._4_4_,iVar21);
                          }
                          else {
                            iVar21 = std::__cxx11::string::compare(local_208);
                            if (iVar21 == 0) {
                              iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                              bVar19 = iVar21 == 0;
                            }
                            else {
                              iVar21 = std::__cxx11::string::compare(local_208);
                              if (iVar21 == 0) {
                                iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                                value = (Value)(iVar21 != 0);
                              }
                              else {
                                iVar21 = std::__cxx11::string::compare(local_208);
                                if (iVar21 == 0) {
                                  iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                                  local_2f4 = CONCAT11(local_2f4._1_1_,iVar21 == 0);
                                }
                                else {
                                  iVar21 = std::__cxx11::string::compare(local_208);
                                  if (iVar21 == 0) {
                                    iVar21 = std::__cxx11::string::compare((char *)&local_2a0);
                                    local_2f4 = CONCAT11(iVar21 == 0,(byte)local_2f4);
                                  }
                                  else {
                                    iVar21 = std::__cxx11::string::compare(local_208);
                                    if (iVar21 == 0) {
                                      local_308 = pugi::xml_attribute::as_int(&local_2e8,local_308);
                                    }
                                    else {
                                      iVar21 = std::__cxx11::string::compare(local_208);
                                      if (iVar21 == 0) {
                                        iVar21 = pugi::xml_attribute::as_int(&local_2e8,0);
                                        local_300 = CONCAT44(local_300._4_4_,iVar21);
                                      }
                                      else {
                                        iVar21 = std::__cxx11::string::compare(local_208);
                                        if (iVar21 == 0) {
                                          iVar21 = pugi::xml_attribute::as_int(&local_2e8,0);
                                          local_300 = CONCAT44(iVar21,(undefined4)local_300);
                                        }
                                        else {
                                          iVar21 = std::__cxx11::string::compare(local_208);
                                          if (iVar21 == 0) {
                                            iVar21 = std::__cxx11::string::compare
                                                               ((char *)&local_2a0);
                                            if ((iVar21 == 0) ||
                                               (iVar21 = std::__cxx11::string::compare
                                                                   ((char *)&local_2a0), iVar21 == 0
                                               )) {
                                              local_2f8 = 0;
                                            }
                                            else {
                                              iVar21 = std::__cxx11::string::compare
                                                                 ((char *)&local_2a0);
                                              if (iVar21 == 0) {
                                                local_2f8 = 1;
                                              }
                                              else {
                                                iVar21 = std::__cxx11::string::compare
                                                                   ((char *)&local_2a0);
                                                pcVar46 = "Invalid splitter appearance \"%s\"";
                                                if (iVar21 != 0) goto LAB_0016f597;
                                                local_2f8 = 0xffffffff;
                                              }
                                            }
                                          }
                                          else {
                                            iVar21 = std::__cxx11::string::compare(local_208);
                                            if (iVar21 == 0) {
                                              iVar21 = std::__cxx11::string::compare
                                                                 ((char *)&local_2a0);
                                              if (iVar21 == 0) {
                                                pull_to = VALUE_TRUE;
                                              }
                                              else {
                                                iVar21 = std::__cxx11::string::compare
                                                                   ((char *)&local_2a0);
                                                props = (ComponentProperties *)(ulong)(iVar21 == 0);
                                                pull_to = (uint)(iVar21 == 0) * 3;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if (local_2a0 != (xml_node_struct *)local_290) {
                      operator_delete(local_2a0,local_290._0_8_ + 1);
                    }
                  }
                  if ((xml_node_struct *)local_208._0_8_ != (xml_node_struct *)(local_208 + 0x10)) {
                    operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
                  }
                  if (bVar20) goto LAB_0016fccd;
                  pugi::xml_named_node_iterator::operator++
                            ((xml_named_node_iterator *)&local_138[0].field_0);
                }
                pcVar46 = local_290 + 0x10;
                iVar21 = std::__cxx11::string::compare(pcVar46);
                if (iVar21 == 0) {
                  component = lsim::ModelCircuit::add_buffer(pCVar1->m_circuit,local_308);
                  bVar20 = true;
                  props = (ComponentProperties *)0x0;
                  handle_buffer(this,component,(ComponentProperties *)&local_348.field_0,false,false
                               );
LAB_0016fc70:
                  if ((bVar20 != false) && (component != (ModelComponent *)0x0)) {
                    lsim::Point::Point((Point *)(local_248 + 0x10),
                                       (float)local_338.field_0.m_x + (float)local_338.field_0.m_x,
                                       (float)local_338.field_0.m_y + (float)local_338.field_0.m_y);
                    lsim::ModelComponent::set_position(component,(Point *)(local_248 + 0x10));
                    iVar21 = 0xb4;
                    if ((ulong)uStack_330 < 3) {
                      props = (ComponentProperties *)&DAT_001a86c8;
                      iVar21 = *(int *)(&DAT_001a86c8 + (ulong)uStack_330 * 4);
                    }
                    lsim::ModelComponent::set_angle(component,iVar21);
                  }
                }
                else {
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_tristate_buffer(pCVar1->m_circuit,local_308)
                    ;
                    bVar20 = true;
                    props = (ComponentProperties *)0x0;
                    handle_buffer(this,component,(ComponentProperties *)&local_348.field_0,true,
                                  bVar19);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_constant(pCVar1->m_circuit,value);
                    pVar26 = lsim::ModelComponent::pin_id(component,0);
                    bVar20 = true;
                    add_pin_location(this,&local_338,pVar26);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    if ((byte)local_2f4 == '\0') {
                      component = lsim::ModelCircuit::add_connector_in
                                            (pCVar1->m_circuit,paStack_328->_M_local_buf,local_308,
                                             false);
                    }
                    else {
                      component = lsim::ModelCircuit::add_connector_out
                                            (pCVar1->m_circuit,paStack_328->_M_local_buf,local_308,
                                             false);
                    }
                    pVar26 = lsim::ModelComponent::pin_id(component,0);
                    props = (ComponentProperties *)
                            (ulong)(component->m_outputs + component->m_inputs);
                    add_pin_location(this,&local_338,pVar26,(size_t)props);
                    pmVar25 = std::
                              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)(&(local_2a8->_M_t)._M_impl.field_0x0 +
                                              (uint)(byte)local_2f4 * 0x30),&local_338.m_full);
                    std::__cxx11::string::_M_assign((string *)pmVar25);
                    bVar20 = true;
                    if (((byte)local_2f4 == '\x01') && (uStack_330 < 4)) {
                      uStack_330 = 1;
                    }
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_and_gate
                                          (pCVar1->m_circuit,(uint32_t)uStack_340);
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_or_gate
                                          (pCVar1->m_circuit,(uint32_t)uStack_340);
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_not_gate(pCVar1->m_circuit);
                    uStack_340 = CONCAT44(uStack_340._4_4_,1);
                    pcVar46 = "%d-bit gates are not supported";
                    if (local_308 != 1) goto LAB_0016fd4d;
                    if (local_348.field_0.m_y == 0) {
                      local_348.field_0.m_y = 0x1e;
                    }
                    local_238[0] = input_pin_location(local_338.field_0,(Position)0x0,
                                                      (uint32_t)&local_348,props);
                    pVar26 = lsim::ModelComponent::input_pin_id(component,0);
                    add_pin_location(this,(Position *)(local_248 + 0x10),pVar26);
                    pVar26 = lsim::ModelComponent::output_pin_id(component,0);
                    bVar20 = true;
                    add_pin_location(this,&local_338,pVar26);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_nand_gate
                                          (pCVar1->m_circuit,(uint32_t)uStack_340);
                    local_304 = CONCAT11(local_304._1_1_,1);
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    component = lsim::ModelCircuit::add_nor_gate
                                          (pCVar1->m_circuit,(uint32_t)uStack_340);
                    local_304 = CONCAT11(local_304._1_1_,1);
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    pcVar46 = "XOR-gates with %d inputs are not supported";
                    if ((uint32_t)uStack_340 != 2) {
LAB_0016fd4d:
                      error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                ,pcVar46);
                      goto LAB_0016fccd;
                    }
                    component = lsim::ModelCircuit::add_xor_gate(pCVar1->m_circuit);
                    local_348.field_0.m_x = 10;
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 == 0) {
                    pcVar46 = "XOR-gates with %d inputs are not supported";
                    if ((uint32_t)uStack_340 != 2) goto LAB_0016fd4d;
                    component = lsim::ModelCircuit::add_xnor_gate(pCVar1->m_circuit);
                    local_348.field_0.m_x = 10;
                    local_304 = CONCAT11(local_304._1_1_,1);
                    bVar20 = handle_gate(this,component,(ComponentProperties *)&local_348.field_0);
                    goto LAB_0016fc70;
                  }
                  iVar21 = std::__cxx11::string::compare(pcVar46);
                  if (iVar21 != 0) {
                    pcVar46 = local_290 + 0x10;
                    iVar21 = std::__cxx11::string::compare(pcVar46);
                    if (iVar21 == 0) {
                      handle_tunnel(this,(ComponentProperties *)&local_348.field_0);
                    }
                    else {
                      iVar21 = std::__cxx11::string::compare(pcVar46);
                      if (iVar21 == 0) {
                        component = lsim::ModelCircuit::add_pull_resistor(pCVar1->m_circuit,pull_to)
                        ;
                        pVar26 = lsim::ModelComponent::pin_id(component,0);
                        bVar20 = true;
                        add_pin_location(this,&local_338,pVar26);
                        goto LAB_0016fc70;
                      }
                      iVar21 = std::__cxx11::string::compare(pcVar46);
                      if ((iVar21 != 0) &&
                         (iVar21 = std::__cxx11::string::compare(local_290 + 0x10), iVar21 != 0)) {
                        component = handle_sub_circuit(this,(string *)(local_290 + 0x10),
                                                       (ComponentProperties *)&local_348.field_0);
                        if (component != (ModelComponent *)0x0) {
                          bVar20 = true;
                          goto LAB_0016fc70;
                        }
                        error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                  ,"Unsupport component (%s) - loading failed",
                                  local_280._M_dataplus._M_p);
                      }
                    }
                  }
                }
LAB_0016fccd:
                if (paStack_328 != &local_318) {
                  operator_delete(paStack_328,
                                  CONCAT71(local_318._M_allocated_capacity._1_7_,
                                           local_318._M_local_buf[0]) + 1);
                }
                if ((Position *)local_198.m_full != local_188) {
                  operator_delete((void *)local_198,(ulong)(local_188[0].m_full + 1));
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p != &local_280.field_2) {
                operator_delete(local_280._M_dataplus._M_p,
                                (ulong)(local_280.field_2._M_allocated_capacity + 1));
              }
            }
            pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&local_158);
          }
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)&local_348.field_0,
                     &local_258,"wire");
          local_188[0] = local_338;
          local_198 = local_348;
          uStack_190 = uStack_340;
          local_208._16_8_ = local_320;
          local_208._0_8_ = CONCAT44(uStack_32c,uStack_330);
          local_208._8_8_ = paStack_328;
          bVar19 = pugi::xml_named_node_iterator::operator!=
                             ((xml_named_node_iterator *)&local_198.field_0,
                              (xml_named_node_iterator *)local_208);
          if (bVar19) {
            do {
              pxVar22 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)&local_198.field_0);
              local_2c0._attr = (xml_attribute_struct *)pxVar22->_root;
              local_138[0].field_0 =
                   (anon_struct_8_2_43e46ec4_for_Position_0)
                   pugi::xml_node::attribute((xml_node *)&local_2c0,"from");
              bVar19 = pugi::xml_attribute::operator!((xml_attribute *)&local_138[0].field_0);
              if (!bVar19) {
                pcVar24 = pugi::xml_attribute::value((xml_attribute *)&local_138[0].field_0);
                std::__cxx11::string::string
                          ((string *)(local_248 + 0x10),pcVar24,(allocator *)local_118);
                local_e8._wrap._root =
                     (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&local_2c0,"to");
                bVar19 = pugi::xml_attribute::operator!((xml_attribute *)&local_e8);
                if (!bVar19) {
                  pcVar24 = pugi::xml_attribute::value((xml_attribute *)&local_e8);
                  std::__cxx11::string::string
                            ((string *)local_118,pcVar24,(allocator *)(local_290 + 0x10));
                  local_158._M_dataplus._M_p = (pointer)0x0;
                  local_178._M_dataplus._M_p = (pointer)0x0;
                  bVar19 = parse_location((LogisimParser *)(local_248 + 0x10),&local_158,pos_00);
                  if ((bVar19) &&
                     (bVar19 = parse_location((LogisimParser *)local_118,&local_178,pos_01),
                     _Var18._M_p = local_158._M_dataplus._M_p, bVar19)) {
                    this_02 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                              point_on_wire((LogisimParser *)
                                            (this->m_context).m_wires.
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (Position)
                                            (this->m_context).m_wires.
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
                    _Var17._M_p = local_178._M_dataplus._M_p;
                    this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                              point_on_wire((LogisimParser *)
                                            (this->m_context).m_wires.
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (Position)
                                            (this->m_context).m_wires.
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
                    if (this_02 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0 &&
                        this_03 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                      local_2a0 = (xml_node_struct *)_Var18._M_p;
                      local_298 = (xml_node_struct *)_Var17._M_p;
                      props = (ComponentProperties *)local_248;
                      __l._M_len = 2;
                      __l._M_array = (iterator)&local_2a0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 (local_290 + 0x10),__l,(allocator_type *)props);
                      std::
                      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::push_back(local_2b0,
                                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (local_290 + 0x10));
                      if (local_280._M_dataplus._M_p != (char_t *)0x0) {
                        operator_delete(local_280._M_dataplus._M_p,
                                        local_280.field_2._M_allocated_capacity -
                                        (long)local_280._M_dataplus._M_p);
                      }
                    }
                    else {
                      uVar41 = (uint7)((ulong)props >> 8);
                      bVar19 = this_03 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0
                               || this_02 ==
                                  (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0;
                      props = (ComponentProperties *)CONCAT71(uVar41,bVar19);
                      if (bVar19) {
                        bVar19 = this_03 !=
                                 (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0 ||
                                 this_02 ==
                                 (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0;
                        props = (ComponentProperties *)CONCAT71(uVar41,bVar19);
                        if (bVar19) {
                          props = (ComponentProperties *)((ulong)uVar41 << 8);
                          if (this_02 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0
                              && this_03 !=
                                 (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                            iVar47._M_current = *(unsigned_long **)(this_03 + 8);
                            if (iVar47._M_current == *(pointer *)(this_03 + 0x10)) {
                              __args = &local_158;
                              goto LAB_001700e7;
                            }
                            *iVar47._M_current = (unsigned_long)_Var18._M_p;
                            *(unsigned_long **)(this_03 + 8) = iVar47._M_current + 1;
                          }
                        }
                        else {
                          iVar47._M_current = *(unsigned_long **)(this_02 + 8);
                          if (iVar47._M_current == *(unsigned_long **)(this_02 + 0x10)) {
                            __args = &local_178;
                            this_03 = this_02;
LAB_001700e7:
                            std::vector<unsigned_long,std::allocator<unsigned_long>>::
                            _M_realloc_insert<unsigned_long_const&>
                                      (this_03,iVar47,(unsigned_long *)__args);
                          }
                          else {
                            *iVar47._M_current = (unsigned_long)_Var17._M_p;
                            *(unsigned_long **)(this_02 + 8) = iVar47._M_current + 1;
                          }
                        }
                      }
                      else {
                        puVar48 = *(pointer *)this_03;
                        puVar8 = *(pointer *)(this_03 + 8);
                        if (puVar48 != puVar8) {
                          do {
                            iVar47._M_current = *(unsigned_long **)(this_02 + 8);
                            if (iVar47._M_current == *(unsigned_long **)(this_02 + 0x10)) {
                              std::vector<unsigned_long,std::allocator<unsigned_long>>::
                              _M_realloc_insert<unsigned_long_const&>(this_02,iVar47,puVar48);
                            }
                            else {
                              *iVar47._M_current = *puVar48;
                              *(unsigned_long **)(this_02 + 8) = iVar47._M_current + 1;
                            }
                            puVar48 = puVar48 + 1;
                          } while (puVar48 != puVar8);
                          if (*(pointer *)(this_03 + 8) != *(pointer *)this_03) {
                            *(pointer *)(this_03 + 8) = *(pointer *)this_03;
                          }
                        }
                        __position = std::
                                     __find_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_long,std::allocator<unsigned_long>>const>>
                                               ((this->m_context).m_wires.
                                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (this->m_context).m_wires.
                                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish,this_03);
                        std::
                        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ::_M_erase(local_2b0,(iterator)__position._M_current);
                      }
                    }
                  }
                  if ((xml_node_struct *)local_118._0_8_ != (xml_node_struct *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                  }
                }
                if ((undefined1 *)local_238[0].m_full != local_248 + 0x20) {
                  operator_delete((void *)local_238[0],(ulong)(local_228._M_p + 1));
                }
              }
              pugi::xml_named_node_iterator::operator++
                        ((xml_named_node_iterator *)&local_198.field_0);
              bVar19 = pugi::xml_named_node_iterator::operator!=
                                 ((xml_named_node_iterator *)&local_198.field_0,
                                  (xml_named_node_iterator *)local_208);
            } while (bVar19);
          }
          pvVar7 = (this->m_context).m_wires.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar49 = (this->m_context).m_wires.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pvVar49 != pvVar7;
              pvVar49 = pvVar49 + 1) {
            this_04 = lsim::ModelCircuit::create_wire(pCVar1->m_circuit);
            puVar8 = (pvVar49->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            for (puVar48 = (pvVar49->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start; puVar48 != puVar8;
                puVar48 = puVar48 + 1) {
              uVar32 = (this->m_context).m_pin_locs._M_h._M_bucket_count;
              props = (ComponentProperties *)*puVar48;
              uVar42 = (ulong)props % uVar32;
              p_Var9 = (this->m_context).m_pin_locs._M_h._M_buckets[uVar42];
              if (p_Var9 != (__node_base_ptr)0x0) {
                p_Var27 = p_Var9->_M_nxt;
                pCVar10 = (ComponentProperties *)p_Var27[1]._M_nxt;
joined_r0x001701d2:
                if (pCVar10 != props) goto LAB_001701d4;
                p_Var28 = p_Var27[4]._M_nxt;
                for (p_Var27 = p_Var27[3]._M_nxt; p_Var27 != p_Var28; p_Var27 = p_Var27 + 1) {
                  lsim::ModelWire::add_pin(this_04,(pin_id_t)p_Var27->_M_nxt);
                }
              }
LAB_00170211:
            }
            if ((this_04->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                (this_04->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lsim::ModelCircuit::remove_wire(pCVar1->m_circuit,this_04->m_id);
            }
          }
          local_348.m_full = 0xffffff2400000000;
          local_238[0].m_full = 0;
          uVar37 = CONCAT71((int7)((ulong)props >> 8),1);
          local_1c0 = &local_348;
          lVar31 = 0;
          do {
            local_248._12_4_ = (undefined4)uVar37;
            local_a0 = &local_2a8[lVar31]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var30 = local_2a8[lVar31]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var30 != local_a0) {
              do {
                p_Var27 = (_Hash_node_base *)
                          std::
                          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_2d0,(string *)&p_Var30[1]._M_parent);
                uVar32 = (this->m_context).m_ipin_offsets._M_h._M_bucket_count;
                uVar42 = (ulong)p_Var27 % uVar32;
                p_Var9 = (this->m_context).m_ipin_offsets._M_h._M_buckets[uVar42];
                if (p_Var9 != (__node_base_ptr)0x0) {
                  __s1 = p_Var30[1]._M_parent;
                  __n = p_Var30[1]._M_left;
                  p_Var28 = p_Var9->_M_nxt;
                  p_Var36 = p_Var28[6]._M_nxt;
                  do {
                    if (((p_Var36 == p_Var27) && ((_Base_ptr)p_Var28[2]._M_nxt == __n)) &&
                       ((__n == (_Base_ptr)0x0 ||
                        (iVar21 = bcmp(__s1,p_Var28[1]._M_nxt,(size_t)__n), iVar21 == 0))))
                    goto LAB_00170520;
                    p_Var28 = p_Var28->_M_nxt;
                  } while ((p_Var28 != (_Hash_node_base *)0x0) &&
                          (p_Var36 = p_Var28[6]._M_nxt, (ulong)p_Var36 % uVar32 == uVar42));
                }
                p_Var28 = (_Hash_node_base *)operator_new(0x38);
                p_Var28->_M_nxt = (_Hash_node_base *)0x0;
                p_Var28[1]._M_nxt = p_Var28 + 3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(p_Var28 + 1),p_Var30[1]._M_parent,
                           (long)&(p_Var30[1]._M_parent)->_M_color +
                           (long)&(p_Var30[1]._M_left)->_M_color);
                p_Var28[5]._M_nxt = (_Hash_node_base *)0x0;
                auVar50 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                    ((ulong)local_1c8,
                                     (this->m_context).m_ipin_offsets._M_h._M_bucket_count,
                                     (this->m_context).m_ipin_offsets._M_h._M_element_count);
                sVar43 = auVar50._8_8_;
                if ((auVar50 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  __s = ((_Hashtable *)&local_2d0->_M_buckets)->_M_buckets;
                }
                else {
                  if (sVar43 == 1) {
                    *local_2d8 = (_Hash_node_base *)0x0;
                    __s = local_2d8;
                  }
                  else {
                    __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                    ((new_allocator<std::__detail::_Hash_node_base_*> *)local_118,
                                     sVar43,(void *)0x0);
                    memset(__s,0,sVar43 * 8);
                  }
                  _Var38._M_nxt = local_2c8->_M_nxt;
                  local_2c8->_M_nxt = (_Hash_node_base *)0x0;
                  if (_Var38._M_nxt != (_Hash_node_base *)0x0) {
                    uVar32 = 0;
                    do {
                      p_Var36 = (_Var38._M_nxt)->_M_nxt;
                      uVar42 = (ulong)_Var38._M_nxt[6]._M_nxt % sVar43;
                      if (__s[uVar42] == (_Hash_node_base *)0x0) {
                        (_Var38._M_nxt)->_M_nxt = local_2c8->_M_nxt;
                        local_2c8->_M_nxt = _Var38._M_nxt;
                        __s[uVar42] = local_2c8;
                        if ((_Var38._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                          pp_Var29 = __s + uVar32;
                          goto LAB_00170445;
                        }
                      }
                      else {
                        (_Var38._M_nxt)->_M_nxt = __s[uVar42]->_M_nxt;
                        pp_Var29 = &__s[uVar42]->_M_nxt;
                        uVar42 = uVar32;
LAB_00170445:
                        *pp_Var29 = _Var38._M_nxt;
                      }
                      _Var38._M_nxt = p_Var36;
                      uVar32 = uVar42;
                    } while (p_Var36 != (_Hash_node_base *)0x0);
                  }
                  pp_Var11 = ((_Hashtable *)&local_2d0->_M_buckets)->_M_buckets;
                  if (local_2d8 != pp_Var11) {
                    operator_delete(pp_Var11,(this->m_context).m_ipin_offsets._M_h._M_bucket_count
                                             << 3);
                  }
                  (this->m_context).m_ipin_offsets._M_h._M_bucket_count = sVar43;
                  (this->m_context).m_ipin_offsets._M_h._M_buckets = __s;
                  uVar42 = (ulong)p_Var27 % sVar43;
                }
                p_Var28[6]._M_nxt = p_Var27;
                if (__s[uVar42] == (_Hash_node_base *)0x0) {
                  p_Var27 = local_2c8->_M_nxt;
                  p_Var28->_M_nxt = p_Var27;
                  local_2c8->_M_nxt = p_Var28;
                  if (p_Var27 != (_Hash_node_base *)0x0) {
                    __s[(ulong)p_Var27[6]._M_nxt %
                        (this->m_context).m_ipin_offsets._M_h._M_bucket_count] = p_Var28;
                    __s = (this->m_context).m_ipin_offsets._M_h._M_buckets;
                  }
                  __s[uVar42] = local_2c8;
                }
                else {
                  p_Var28->_M_nxt = __s[uVar42]->_M_nxt;
                  __s[uVar42]->_M_nxt = p_Var28;
                }
                psVar6 = &(this->m_context).m_ipin_offsets._M_h._M_element_count;
                *psVar6 = *psVar6 + 1;
LAB_00170520:
                aVar12 = local_1c0->field_0;
                p_Var28[5]._M_nxt = (_Hash_node_base *)aVar12;
                (local_1c0->field_0).m_y = aVar12.m_y + 0x14;
                p_Var30 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var30);
              } while (p_Var30 != local_a0);
            }
            lVar31 = 1;
            local_1c0 = (Position *)(local_248 + 0x10);
            uVar37 = 0;
          } while ((local_248._12_4_ & 1) != 0);
          std::__cxx11::string::string((string *)&local_348.field_0,local_a8,(allocator *)local_118)
          ;
          uVar32 = std::_Hash_bytes((void *)local_348,uStack_340,0xc70f6907);
          __n_00 = (__node_ptr)(this->m_circuits)._M_h._M_bucket_count;
          __key = (key_type *)(uVar32 % (ulong)__n_00);
          p_Var33 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_node((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                    *)(this->m_circuits)._M_h._M_buckets,(size_type)__n_00,__key,
                                   local_348.m_full);
          if (p_Var33 == (__node_ptr)0x0) {
            p_Var33 = (__node_ptr)operator_new(0x158);
            (p_Var33->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
            pPVar34 = (Position *)
                      ((long)&(p_Var33->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 0x10);
            *(Position **)
             &(p_Var33->
              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
              ._M_storage._M_storage = pPVar34;
            if ((Position *)local_348.m_full == &local_338) {
              pPVar34->m_full = (uint64_t)local_338;
              *(ulong *)((long)&(p_Var33->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                ._M_storage._M_storage + 0x18) = CONCAT44(uStack_32c,uStack_330);
            }
            else {
              *(Position *)
               &(p_Var33->
                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                ).
                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                ._M_storage._M_storage = local_348;
              ((Position *)
              ((long)&(p_Var33->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                      ._M_storage._M_storage + 0x10))->m_full = (uint64_t)local_338;
            }
            *(ulong *)((long)&(p_Var33->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 8) = uStack_340;
            uStack_340 = 0;
            local_338.m_full = local_338.m_full & 0xffffffffffffff00;
            local_348.m_full = (uint64_t)&local_338;
            memset((void *)((long)&(p_Var33->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                   ._M_storage._M_storage + 0x20),0,0x118);
            *(undefined1 **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x28) =
                 (undefined1 *)
                 ((long)&(p_Var33->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0x58);
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x30) = 1;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x38) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x40) = 0;
            *(undefined4 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x48) = 0x3f800000;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x50) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x58) = 0;
            lVar31 = 0x70;
            do {
              lVar3 = (long)&(p_Var33->super__Hash_node_base)._M_nxt + lVar31;
              *(undefined4 *)((long)&(p_Var33->super__Hash_node_base)._M_nxt + lVar31) = 0;
              *(undefined8 *)
               ((long)&(p_Var33->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                       ._M_storage._M_storage + lVar31) = 0;
              *(long *)((long)&(p_Var33->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + lVar31 + 8) = lVar3;
              *(long *)((long)&(p_Var33->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + lVar31 + 0x10) = lVar3;
              *(undefined8 *)
               ((long)&(p_Var33->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                       ._M_storage._M_storage + lVar31 + 0x18) = 0;
              lVar31 = lVar31 + 0x30;
            } while (lVar31 != 0xd0);
            *(undefined1 **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xc0) =
                 (undefined1 *)
                 ((long)&(p_Var33->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0xf0);
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 200) = 1;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xd0) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xd8) = 0;
            *(undefined4 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xe0) = 0x3f800000;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xe8) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xf0) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xf8) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x100) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x108) = 0;
            *(undefined1 **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x110) =
                 (undefined1 *)
                 ((long)&(p_Var33->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0x140);
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x118) = 1;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x120) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x128) = 0;
            *(undefined4 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x130) = 0x3f800000;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x138) = 0;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x140) = 0;
            __n_00 = (__node_ptr)(this->m_circuits)._M_h._M_bucket_count;
            auVar50 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                (local_c8,(ulong)__n_00,(this->m_circuits)._M_h._M_element_count);
            sVar43 = auVar50._8_8_;
            if ((auVar50 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              __s_00 = (this->m_circuits)._M_h._M_buckets;
            }
            else {
              if (sVar43 == 1) {
                *local_1e0 = (_Hash_node_base *)0x0;
                __s_00 = local_1e0;
              }
              else {
                __s_00 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                   ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                    (local_248 + 0x10),sVar43,(void *)0x0);
                __n_00 = (__node_ptr)0x0;
                memset(__s_00,0,sVar43 * 8);
              }
              _Var38._M_nxt = local_2b8->_M_nxt;
              local_2b8->_M_nxt = (_Hash_node_base *)0x0;
              if ((__node_ptr)_Var38._M_nxt != (__node_ptr)0x0) {
                uVar42 = 0;
                do {
                  __n_00 = (__node_ptr)((_Hash_node_base *)&(_Var38._M_nxt)->_M_nxt)->_M_nxt;
                  uVar44 = (ulong)(((__node_ptr)(_Var38._M_nxt + 0x2a))->super__Hash_node_base).
                                  _M_nxt % sVar43;
                  if (__s_00[uVar44] == (_Hash_node_base *)0x0) {
                    ((_Hash_node_base *)&(_Var38._M_nxt)->_M_nxt)->_M_nxt = local_2b8->_M_nxt;
                    local_2b8->_M_nxt = _Var38._M_nxt;
                    __s_00[uVar44] = local_2b8;
                    if (((_Hash_node_base *)&(_Var38._M_nxt)->_M_nxt)->_M_nxt !=
                        (_Hash_node_base *)0x0) {
                      pp_Var35 = __s_00 + uVar42;
                      goto LAB_00170800;
                    }
                  }
                  else {
                    ((_Hash_node_base *)&(_Var38._M_nxt)->_M_nxt)->_M_nxt = __s_00[uVar44]->_M_nxt;
                    pp_Var35 = &__s_00[uVar44]->_M_nxt;
                    uVar44 = uVar42;
LAB_00170800:
                    *pp_Var35 = _Var38._M_nxt;
                  }
                  _Var38._M_nxt = (_Hash_node_base *)__n_00;
                  uVar42 = uVar44;
                } while (__n_00 != (__node_ptr)0x0);
              }
              pp_Var11 = (this->m_circuits)._M_h._M_buckets;
              if (local_1e0 != pp_Var11) {
                __n_00 = (__node_ptr)((this->m_circuits)._M_h._M_bucket_count << 3);
                operator_delete(pp_Var11,(ulong)__n_00);
              }
              (this->m_circuits)._M_h._M_bucket_count = sVar43;
              (this->m_circuits)._M_h._M_buckets = __s_00;
              __key = (key_type *)(uVar32 % sVar43);
            }
            (p_Var33->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
            ).super__Hash_node_code_cache<true>._M_hash_code = uVar32;
            if (__s_00[(long)__key] == (_Hash_node_base *)0x0) {
              p_Var27 = local_2b8->_M_nxt;
              (p_Var33->super__Hash_node_base)._M_nxt = p_Var27;
              local_2b8->_M_nxt = (_Hash_node_base *)p_Var33;
              if (p_Var27 != (_Hash_node_base *)0x0) {
                __s_00[(ulong)p_Var27[0x2a]._M_nxt % (this->m_circuits)._M_h._M_bucket_count] =
                     (__node_base_ptr)p_Var33;
                __s_00 = (this->m_circuits)._M_h._M_buckets;
              }
              __s_00[(long)__key] = local_2b8;
            }
            else {
              (p_Var33->super__Hash_node_base)._M_nxt = __s_00[(long)__key]->_M_nxt;
              __s_00[(long)__key]->_M_nxt = (_Hash_node_base *)p_Var33;
            }
            psVar2 = &(this->m_circuits)._M_h._M_element_count;
            *psVar2 = *psVar2 + 1;
          }
          puVar4 = (undefined1 *)
                   ((long)&(p_Var33->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                           ._M_storage._M_storage + 0x20);
          *(ModelCircuit **)
           ((long)&(p_Var33->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x20) = pCVar1->m_circuit;
          if (pCVar1 != (CircuitConstruction *)puVar4) {
            this_00 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                        **)((long)&(p_Var33->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                   ._M_storage._M_storage + 0x38);
            while (this_00 !=
                   (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                    *)0x0) {
              p_Var13 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                          **)this_00;
              std::__detail::
              _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
              ::_M_deallocate_node(this_00,__n_00);
              this_00 = p_Var13;
            }
            pxVar39 = *(xml_node_struct **)
                       ((long)&(p_Var33->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + 0x28);
            pxVar5 = (xml_node_struct *)
                     ((long)&(p_Var33->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                             ._M_storage._M_storage + 0x58);
            if (pxVar5 != pxVar39) {
              operator_delete(pxVar39,*(long *)((long)&(p_Var33->
                                                                                                              
                                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                                  ._M_storage._M_storage + 0x30) << 3);
            }
            sVar16 = *(size_t *)(local_b8._M_nxt + 1);
            *(_Hash_node_base **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x48) = (local_b8._M_nxt)->_M_nxt;
            *(size_t *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x50) = sVar16;
            pxVar39 = (xml_node_struct *)((_Hashtable *)&local_1d8->_M_buckets)->_M_buckets;
            if (local_260 == pxVar39) {
              pxVar5->header = (uintptr_t)local_260->header;
              pxVar39 = pxVar5;
            }
            *(xml_node_struct **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x28) = pxVar39;
            uVar32 = (this->m_context).m_pin_locs._M_h._M_bucket_count;
            *(ulong *)((long)&(p_Var33->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 0x30) = uVar32;
            p_Var27 = (this->m_context).m_pin_locs._M_h._M_before_begin._M_nxt;
            *(_Hash_node_base **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x38) = p_Var27;
            *(size_type *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x40) =
                 (this->m_context).m_pin_locs._M_h._M_element_count;
            if (p_Var27 != (_Hash_node_base *)0x0) {
              (&pxVar39->header)[(ulong)p_Var27[1]._M_nxt % uVar32] =
                   (uintptr_t)
                   ((long)&(p_Var33->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                           ._M_storage._M_storage + 0x38);
            }
            (this->m_context).m_pin_locs._M_h._M_rehash_policy._M_next_resize = 0;
            (this->m_context).m_pin_locs._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (this->m_context).m_pin_locs._M_h._M_bucket_count = 1;
            (this->m_context).m_pin_locs._M_h._M_buckets = (__buckets_ptr)local_260;
            local_c0->_M_nxt = (_Hash_node_base *)0x0;
            local_c0[1] = (_Hash_node_base *)0x0;
          }
          pmVar45 = local_2a8;
          lVar31 = 0;
          do {
            __n_01 = (__node_ptr)(&(pmVar45->_M_t)._M_impl.field_0x0 + lVar31);
            std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator=((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&(p_Var33->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                   ._M_storage._M_storage + lVar31 + 0x60),
                        (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)__n_01);
            lVar31 = lVar31 + 0x30;
          } while (lVar31 != 0x60);
          if (pCVar1 != (CircuitConstruction *)puVar4) {
            this_01 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                        **)((long)&(p_Var33->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                   ._M_storage._M_storage + 0xd0);
            while (this_01 !=
                   (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                    *)0x0) {
              p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                          **)this_01;
              std::__detail::
              _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
              ::_M_deallocate_node(this_01,__n_01);
              this_01 = p_Var14;
            }
            pp_Var40 = *(_Hash_node_base ***)
                        ((long)&(p_Var33->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                ._M_storage._M_storage + 0xc0);
            pp_Var11 = (_Hash_node_base **)
                       ((long)&(p_Var33->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + 0xf0);
            if (pp_Var11 != pp_Var40) {
              operator_delete(pp_Var40,*(long *)((long)&(p_Var33->
                                                                                                                
                                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                                  ._M_storage._M_storage + 200) << 3);
            }
            sVar16 = local_1c8->_M_next_resize;
            *(undefined8 *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xe0) = *(undefined8 *)local_1c8;
            *(size_t *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xe8) = sVar16;
            pp_Var40 = ((_Hashtable *)&local_2d0->_M_buckets)->_M_buckets;
            if (local_2d8 == pp_Var40) {
              *pp_Var11 = *local_2d8;
              pp_Var40 = pp_Var11;
            }
            *(_Hash_node_base ***)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xc0) = pp_Var40;
            uVar32 = (this->m_context).m_ipin_offsets._M_h._M_bucket_count;
            *(ulong *)((long)&(p_Var33->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 200) = uVar32;
            p_Var27 = (this->m_context).m_ipin_offsets._M_h._M_before_begin._M_nxt;
            *(_Hash_node_base **)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xd0) = p_Var27;
            *(size_type *)
             ((long)&(p_Var33->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xd8) =
                 (this->m_context).m_ipin_offsets._M_h._M_element_count;
            if (p_Var27 != (_Hash_node_base *)0x0) {
              pp_Var40[(ulong)p_Var27[6]._M_nxt % uVar32] =
                   (_Hash_node_base *)
                   ((long)&(p_Var33->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                           ._M_storage._M_storage + 0xd0);
            }
            (this->m_context).m_ipin_offsets._M_h._M_rehash_policy._M_next_resize = 0;
            (this->m_context).m_ipin_offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (this->m_context).m_ipin_offsets._M_h._M_bucket_count = 1;
            (this->m_context).m_ipin_offsets._M_h._M_buckets = local_2d8;
            local_2c8->_M_nxt = (_Hash_node_base *)0x0;
            local_2c8[1] = (_Hash_node_base *)0x0;
          }
          local_228._M_p =
               *(pointer *)
                ((long)&(p_Var33->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                        ._M_storage._M_storage + 0x108);
          pvVar49 = (this->m_context).m_wires.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_238[0] = *(Position *)
                          ((long)&(p_Var33->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                  ._M_storage._M_storage + 0xf8);
          local_238[1] = *(Position *)
                          ((long)&(p_Var33->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                  ._M_storage._M_storage + 0x100);
          *(pointer *)
           ((long)&(p_Var33->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xf8) =
               (this->m_context).m_wires.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(p_Var33->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x100) = pvVar49;
          *(pointer *)
           ((long)&(p_Var33->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x108) =
               (this->m_context).m_wires.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (local_2b0->
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_2b0->
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_2b0->
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)(local_248 + 0x10));
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)((long)&(p_Var33->
                                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                      ._M_storage._M_storage + 0x110),local_1d0);
          pmVar45 = local_2a8;
          if ((Position *)local_348.m_full != &local_338) {
            operator_delete((void *)local_348,(ulong)(local_338.m_full + 1));
          }
        }
        pugi::xml_named_node_iterator::operator++(&local_98);
        bVar19 = pugi::xml_named_node_iterator::operator!=(&local_98,&local_78);
      } while (bVar19);
    }
    local_348.field_0 =
         (anon_struct_8_2_43e46ec4_for_Position_0)pugi::xml_node::child(&local_1b8,"main");
    bVar19 = pugi::xml_node::operator!((xml_node *)&local_348.field_0);
    if (!bVar19) {
      local_238[0].field_0 =
           (anon_struct_8_2_43e46ec4_for_Position_0)
           pugi::xml_node::attribute((xml_node *)&local_348.field_0,"name");
      pcVar24 = pugi::xml_attribute::value((xml_attribute *)(local_248 + 0x10));
      pLVar15 = this->m_lsim_context;
      pcVar46 = (char *)(pLVar15->m_user_library).m_main_circuit._M_string_length;
      strlen(pcVar24);
      std::__cxx11::string::_M_replace
                ((ulong)&(pLVar15->m_user_library).m_main_circuit,0,pcVar46,(ulong)pcVar24);
    }
    bVar19 = !bVar19;
  }
  return bVar19;
LAB_001701d4:
  p_Var27 = p_Var27->_M_nxt;
  if ((p_Var27 == (_Hash_node_base *)0x0) ||
     (pCVar10 = (ComponentProperties *)p_Var27[1]._M_nxt, (ulong)pCVar10 % uVar32 != uVar42))
  goto LAB_00170211;
  goto joined_r0x001701d2;
}

Assistant:

bool LogisimParser::parse_xml() {

    auto project_node = m_xml_doc->child("project");
    if (!project_node) {
        return false;
    }

    /* iterate all circuits */
    for (auto circuit_node : project_node.children("circuit")) {
        parse_circuit(circuit_node);
    }

    /* get main circuit */
    auto main_node = project_node.child("main");
    if (!main_node) {
        return false;
    }

    auto main_circuit = main_node.attribute("name").value();
    m_lsim_context->user_library()->change_main_circuit(main_circuit);
    return true;
}